

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

bool __thiscall Spi::writeBin(Spi *this,string *filename)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  FILE *__stream_00;
  size_t sVar3;
  ostream *poVar4;
  size_t sVar5;
  pointer pcVar6;
  int addr;
  char *pcVar7;
  int n;
  size_t sStack_150;
  uint8_t buffer_1 [256];
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar6 = (filename->_M_dataplus)._M_p;
    pcVar7 = "Can\'t open \'%s\' for reading: ";
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 == -1) {
      __stream_00 = tmpfile();
      if (__stream_00 == (FILE *)0x0) {
        pcVar7 = "can\'t open temporary file\n";
        sStack_150 = 0x1a;
      }
      else {
        lVar2 = 0;
        do {
          sVar5 = fread(writeBin::buffer,1,0x1000,__stream);
          if (sVar5 == 0) {
            fclose(__stream);
            fseek(__stream_00,0,0);
            goto LAB_001132eb;
          }
          sVar3 = fwrite(writeBin::buffer,1,sVar5,__stream_00);
          lVar2 = lVar2 + sVar5;
        } while (sVar3 == sVar5);
        pcVar7 = "can\'t write to temporary file\n";
        sStack_150 = 0x1e;
      }
      fwrite(pcVar7,sStack_150,1,_stderr);
      return false;
    }
    lVar2 = ftell(__stream);
    if (lVar2 == -1) {
      pcVar6 = (filename->_M_dataplus)._M_p;
      pcVar7 = "%s: ftell: ";
    }
    else {
      iVar1 = fseek(__stream,0,0);
      __stream_00 = __stream;
      if (iVar1 != -1) {
LAB_001132eb:
        poVar4 = std::operator<<((ostream *)&std::cout,"Resetting...");
        std::endl<char,std::char_traits<char>>(poVar4);
        flash_chip_deselect(this);
        buffer_1[0] = 0xfa;
        buffer_1[1] = '\0';
        buffer_1[2] = '\0';
        buffer_1[3] = '\0';
        buffer_1[4] = '\0';
        buffer_1[5] = '\0';
        buffer_1[6] = '\0';
        buffer_1[7] = '\0';
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)buffer_1);
        poVar4 = std::operator<<((ostream *)&std::cout,"cdone: ");
        iVar1 = get_cdone(this);
        pcVar7 = "high";
        if (iVar1 == 0) {
          pcVar7 = "low";
        }
        poVar4 = std::operator<<(poVar4,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar4);
        flash_reset(this);
        flash_power_up(this);
        flash_read_id(this);
        for (iVar1 = 0; iVar1 < (int)((int)lVar2 + 0xffffU & 0xffff0000); iVar1 = iVar1 + 0x10000) {
          flash_write_enable(this);
          flash_64kB_sector_erase(this,iVar1);
          if (this->verbose == true) {
            fwrite("Status after block erase:\n",0x1a,1,_stderr);
            flash_read_status(this);
          }
          flash_wait(this);
        }
        std::operator<<((ostream *)&std::cout,"Programming... ");
        iVar1 = 0;
        while( true ) {
          sVar5 = fread(buffer_1,1,(ulong)(0x100 - iVar1 % 0x100),__stream_00);
          n = (int)sVar5;
          if (n < 1) break;
          flash_write_enable(this);
          flash_prog(this,iVar1,buffer_1,n);
          flash_wait(this);
          iVar1 = iVar1 + n;
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"Done.");
        std::endl<char,std::char_traits<char>>(poVar4);
        fseek(__stream_00,0,0);
        flash_power_down(this);
        set_gpio(this,1,1);
        buffer_1[0] = 0xfa;
        buffer_1[1] = '\0';
        buffer_1[2] = '\0';
        buffer_1[3] = '\0';
        buffer_1[4] = '\0';
        buffer_1[5] = '\0';
        buffer_1[6] = '\0';
        buffer_1[7] = '\0';
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)buffer_1);
        poVar4 = std::operator<<((ostream *)&std::cout,"cdone: ");
        iVar1 = get_cdone(this);
        pcVar7 = "high";
        if (iVar1 == 0) {
          pcVar7 = "low";
        }
        poVar4 = std::operator<<(poVar4,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&std::cout,"Done.");
        std::endl<char,std::char_traits<char>>(poVar4);
        if (__stream_00 == _stdin) {
          return true;
        }
        if (__stream_00 == _stdout) {
          return true;
        }
        fclose(__stream_00);
        return true;
      }
      pcVar6 = (filename->_M_dataplus)._M_p;
      pcVar7 = "%s: fseek: ";
    }
  }
  fprintf(_stderr,pcVar7,pcVar6);
  return false;
}

Assistant:

bool Spi::writeBin(string filename) {
	int rw_offset = 0;

	FILE *f = NULL;
	long file_size = -1;

	f = fopen(filename.c_str(), "rb");

	if (f == NULL) {
		fprintf(stderr, "Can't open '%s' for reading: ", filename.c_str());
		return false;
	}

	if (fseek(f, 0L, SEEK_END) != -1) {
		file_size = ftell(f);
		if (file_size == -1) {
			fprintf(stderr, "%s: ftell: ", filename.c_str());
			return false;
		}
		if (fseek(f, 0L, SEEK_SET) == -1) {
			fprintf(stderr, "%s: fseek: ", filename.c_str());
			return false;
		}
	} else {
		FILE *pipe = f;

		f = tmpfile();
		if (f == NULL) {
			fprintf(stderr, "can't open temporary file\n");
			return false;
		}
		file_size = 0;

		while (true) {
			static unsigned char buffer[4096];
			size_t rc = fread(buffer, 1, 4096, pipe);
			if (rc <= 0)
				break;
			size_t wc = fwrite(buffer, 1, rc, f);
			if (wc != rc) {
				fprintf(stderr, "can't write to temporary file\n");
				return false;
			}
			file_size += rc;
		}
		fclose(pipe);

		/* now seek to the beginning so we can
		 start reading again */
		fseek(f, 0, SEEK_SET);
	}

	cout << "Resetting..." << endl;

	flash_chip_deselect();
	std::this_thread::sleep_for(std::chrono::milliseconds(250));

	cout << "cdone: " << (get_cdone() ? "high" : "low") << endl;

	flash_reset();
	flash_power_up();

	flash_read_id();

	int begin_addr = rw_offset & ~0xffff;
	int end_addr = (rw_offset + file_size + 0xffff) & ~0xffff;

	for (int addr = begin_addr; addr < end_addr; addr += 0x10000) {
		flash_write_enable();
		flash_64kB_sector_erase(addr);
		if (verbose) {
			fprintf(stderr, "Status after block erase:\n");
			flash_read_status();
		}
		flash_wait();
	}

	cout << "Programming... ";

	for (int rc, addr = 0; true; addr += rc) {
		uint8_t buffer[256];
		int page_size = 256 - (rw_offset + addr) % 256;
		rc = fread(buffer, 1, page_size, f);
		if (rc <= 0)
			break;
		flash_write_enable();
		flash_prog(rw_offset + addr, buffer, rc);
		flash_wait();
	}

	cout << "Done." << endl;

	/* seek to the beginning for second pass */
	fseek(f, 0, SEEK_SET);

	// ---------------------------------------------------------
	// Reset
	// ---------------------------------------------------------

	flash_power_down();

	set_gpio(1, 1);
	std::this_thread::sleep_for(std::chrono::milliseconds(250));

	cout << "cdone: " << (get_cdone() ? "high" : "low") << endl;
	cout << "Done." << endl;

	if (f != NULL && f != stdin && f != stdout)
		fclose(f);
	return true;
}